

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
bhf::Commandline::Pop<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Commandline *this,string *errorMessage)

{
  char **ppcVar1;
  undefined8 uVar2;
  undefined1 *unaff_R15;
  allocator local_59;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (this->argc == 0) {
    if (errorMessage->_M_string_length != 0) {
      if ((this->usage).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar2 = std::__throw_bad_function_call();
        if (local_58 != unaff_R15) {
          operator_delete(local_58);
        }
        if (local_38[0] != local_28) {
          operator_delete(local_38[0]);
        }
        _Unwind_Resume(uVar2);
      }
      (*(this->usage)._M_invoker)((_Any_data *)this,errorMessage);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    this->argc = this->argc + -1;
    ppcVar1 = this->argv;
    this->argv = ppcVar1 + 1;
    std::__cxx11::string::string((string *)local_38,*ppcVar1,&local_59);
    local_50 = 0;
    local_48[0] = 0;
    local_58 = local_48;
    bhf::StringTo<std::__cxx11::string>(__return_storage_ptr__,(string *)local_38,&local_58);
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T Pop(const std::string& errorMessage = {})
    {
        if (argc) {
            --argc;
            return StringTo<T>(*(argv++));
        }
        if (!errorMessage.empty()) {
            usage(errorMessage);
        }
        return T {};
    }